

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  Compilation *this;
  Scope *scope;
  SourceLocation loc;
  undefined8 uVar1;
  undefined4 uVar2;
  bitmask<slang::ast::ASTFlags> bVar3;
  bool bVar4;
  ModportPortSymbol *pMVar5;
  Symbol *pSVar6;
  DeclaredType *target;
  Expression *expr;
  Diagnostic *this_00;
  DiagCode code;
  string_view sVar7;
  SourceRange SVar8;
  LookupLocation location;
  Token name;
  ASTContext checkCtx;
  undefined1 isDottedAccess;
  ArgumentDirection local_ac;
  ASTContext *local_a8;
  Compilation *local_a0;
  Token local_98;
  SourceRange local_80;
  SourceLocation local_70;
  ASTContext local_68;
  
  this = ((context->scope).ptr)->compilation;
  local_98.kind = (syntax->name).kind;
  local_98._2_1_ = (syntax->name).field_0x2;
  local_98.numFlags.raw = (syntax->name).numFlags.raw;
  local_98.rawLen = (syntax->name).rawLen;
  local_98.info = (syntax->name).info;
  local_ac = direction;
  local_68._0_16_ = parsing::Token::valueText(&local_98);
  local_70 = parsing::Token::location(&local_98);
  local_a0 = this;
  pMVar5 = BumpAllocator::
           emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                     (&this->super_BumpAllocator,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_70,
                      &local_ac);
  (pMVar5->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  scope = (context->scope).ptr;
  sVar7 = parsing::Token::valueText(&local_98);
  uVar1 = context->scope;
  uVar2 = context->lookupIndex;
  location.index = uVar2;
  location.scope = (Scope *)uVar1;
  local_a8 = context;
  local_80 = parsing::Token::range(&local_98);
  isDottedAccess = local_80.endLoc._0_1_;
  location._12_4_ = 0;
  pSVar6 = Lookup::unqualifiedAt
                     (scope,sVar7,location,local_80,(bitmask<slang::ast::LookupFlags>)0x40);
  pMVar5->internalSymbol = pSVar6;
  if (pSVar6 != (Symbol *)0x0) {
    code.subsystem = Declarations;
    code.code = 0x36;
    if (pSVar6->kind != Subroutine) {
      bVar4 = SemanticFacts::isAllowedInModport(pSVar6->kind);
      code.subsystem = Declarations;
      code.code = 0x8f;
      if (bVar4) {
        if (pMVar5->internalSymbol != (Symbol *)0x0) {
          target = Symbol::getDeclaredType(pMVar5->internalSymbol);
          DeclaredType::setLink(&(pMVar5->super_ValueSymbol).declaredType,target);
          ASTContext::resetFlags(&local_68,local_a8,(bitmask<slang::ast::ASTFlags>)0x100000020);
          bVar3.m_bits = local_68.flags.m_bits;
          if ((local_ac != In) &&
             (bVar3.m_bits = local_68.flags.m_bits | 0x100000, local_ac == InOut)) {
            bVar3.m_bits = local_68.flags.m_bits | 0x4000100000;
          }
          local_68.flags.m_bits = bVar3.m_bits;
          loc = (pMVar5->super_ValueSymbol).super_Symbol.location;
          SVar8.startLoc =
               (pMVar5->super_ValueSymbol).super_Symbol.name._M_len * 0x10000000 + (long)loc;
          SVar8.endLoc = (SourceLocation)0x0;
          expr = ValueExpressionBase::fromSymbol
                           ((ValueExpressionBase *)&local_68,(ASTContext *)pMVar5->internalSymbol,
                            (Symbol *)0x0,(HierarchicalReference *)loc,SVar8,false,
                            (bool)isDottedAccess);
          Expression::checkConnectionDirection
                    (expr,local_ac,&local_68,loc,(bitmask<slang::ast::AssignFlags>)0x0);
          pMVar5->connExpr = expr;
          return pMVar5;
        }
        goto LAB_002499ca;
      }
    }
    SVar8 = parsing::Token::range(&local_98);
    this_00 = ASTContext::addDiag(local_a8,code,SVar8);
    sVar7 = parsing::Token::valueText(&local_98);
    Diagnostic::operator<<(this_00,sVar7);
    Diagnostic::addNote(this_00,(DiagCode)0x50001,pMVar5->internalSymbol->location);
    pMVar5->internalSymbol = (Symbol *)0x0;
  }
LAB_002499ca:
  (pMVar5->super_ValueSymbol).declaredType.type = local_a0->errorType;
  return pMVar5;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    SLANG_ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural | ASTFlags::NotADriver);
    if (direction != ArgumentDirection::In) {
        checkCtx.flags |= ASTFlags::LValue;
        if (direction == ArgumentDirection::InOut)
            checkCtx.flags |= ASTFlags::LAndRValue;
    }

    auto loc = result->location;
    auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, nullptr,
                                                 {loc, loc + result->name.length()});

    Expression::checkConnectionDirection(expr, direction, checkCtx, loc);

    result->connExpr = &expr;
    return *result;
}